

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int FreeEXRImage(EXRImage *exrImage)

{
  long in_RDI;
  int i_1;
  int i;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = -1;
  }
  else {
    for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x1004); local_14 = local_14 + 1) {
      if ((*(long *)(in_RDI + 0x1008) != 0) &&
         (*(long *)(*(long *)(in_RDI + 0x1008) + (long)local_14 * 8) != 0)) {
        free(*(void **)(*(long *)(in_RDI + 0x1008) + (long)local_14 * 8));
      }
      if ((*(long *)(in_RDI + 0x1010) != 0) &&
         (*(long *)(*(long *)(in_RDI + 0x1010) + (long)local_14 * 8) != 0)) {
        free(*(void **)(*(long *)(in_RDI + 0x1010) + (long)local_14 * 8));
      }
    }
    if (*(long *)(in_RDI + 0x1008) != 0) {
      free(*(void **)(in_RDI + 0x1008));
    }
    if (*(long *)(in_RDI + 0x1010) != 0) {
      free(*(void **)(in_RDI + 0x1010));
    }
    if (*(long *)(in_RDI + 0x1018) != 0) {
      free(*(void **)(in_RDI + 0x1018));
    }
    if (*(long *)(in_RDI + 0x1020) != 0) {
      free(*(void **)(in_RDI + 0x1020));
    }
    for (local_18 = 0; local_18 < *(int *)(in_RDI + 0x1000); local_18 = local_18 + 1) {
      if (*(long *)(in_RDI + (long)local_18 * 0x20) != 0) {
        free(*(void **)(in_RDI + (long)local_18 * 0x20));
      }
      if (*(long *)(in_RDI + (long)local_18 * 0x20 + 8) != 0) {
        free(*(void **)(in_RDI + (long)local_18 * 0x20 + 8));
      }
      if (*(long *)(in_RDI + (long)local_18 * 0x20 + 0x18) != 0) {
        free(*(void **)(in_RDI + (long)local_18 * 0x20 + 0x18));
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int FreeEXRImage(EXRImage *exrImage) {

  if (exrImage == NULL) {
    return -1; // Err
  }

  for (int i = 0; i < exrImage->num_channels; i++) {

    if (exrImage->channel_names && exrImage->channel_names[i]) {
      free((char *)exrImage->channel_names[i]); // remove const
    }

    if (exrImage->images && exrImage->images[i]) {
      free(exrImage->images[i]);
    }
  }

  if (exrImage->channel_names) {
    free(exrImage->channel_names);
  }

  if (exrImage->images) {
    free(exrImage->images);
  }

  if (exrImage->pixel_types) {
    free(exrImage->pixel_types);
  }

  if (exrImage->requested_pixel_types) {
    free(exrImage->requested_pixel_types);
  }

  for (int i = 0; i < exrImage->num_custom_attributes; i++) {
    if (exrImage->custom_attributes[i].name) {
      free(exrImage->custom_attributes[i].name);
    }
    if (exrImage->custom_attributes[i].type) {
      free(exrImage->custom_attributes[i].type);
    }
    if (exrImage->custom_attributes[i].value) {
      free(exrImage->custom_attributes[i].value);
    }
  }

  return 0;
}